

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::handle
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,LeafData *ld,
          bool doInsert)

{
  anon_class_16_2_6aee48c9 bindSpecialVar;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *this_00;
  byte in_DL;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *in_RSI;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *in_RDI;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  bindings;
  TypedTermList norm;
  LeafData *in_stack_00000410;
  BindingMap *in_stack_00000418;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *in_stack_00000420;
  SelectedSummand *in_stack_fffffffffffffe98;
  SelectedSummand *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined1 reversed;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *pSVar1;
  TypedTermList in_stack_fffffffffffffec8;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_fffffffffffffee0;
  TypedTermList in_stack_ffffffffffffff28;
  undefined1 local_48 [32];
  TypedTermList local_28;
  byte local_11;
  
  reversed = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
  local_11 = in_DL & 1;
  local_48._16_16_ = (undefined1  [16])Kernel::SelectedSummand::key((SelectedSummand *)in_RSI);
  local_28 = Kernel::Renaming::normalize(in_stack_ffffffffffffff28);
  pSVar1 = (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)local_48;
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_fffffffffffffea0);
  bindSpecialVar.bindings =
       (Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        *)in_RDI;
  bindSpecialVar.this = pSVar1;
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::handle(Inferences::ALASCA::FourierMotzkinConf::Rhs,bool)::_lambda(int,auto:1)_1_>
            (in_RSI,in_stack_fffffffffffffec8,(bool)reversed,bindSpecialVar);
  if ((local_11 & 1) == 0) {
    this_00 = Lib::
              Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              ::operator*((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x4022af);
    Kernel::SelectedSummand::SelectedSummand((SelectedSummand *)this_00,in_stack_fffffffffffffe98);
    Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs((Rhs *)this_00,in_stack_fffffffffffffe98);
    remove(in_RDI,(char *)this_00);
    Inferences::ALASCA::FourierMotzkinConf::Rhs::~Rhs((Rhs *)0x4022f8);
    Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x402302);
  }
  else {
    Lib::
    Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator*((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0x4021d6);
    Kernel::SelectedSummand::SelectedSummand(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs
              ((Rhs *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    insert(in_stack_00000420,in_stack_00000418,in_stack_00000410);
    Inferences::ALASCA::FourierMotzkinConf::Rhs::~Rhs((Rhs *)0x40222e);
    Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x40223b);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(in_stack_fffffffffffffee0);
  return;
}

Assistant:

void handle(LeafData ld, bool doInsert)
    {
      auto norm = Renaming::normalize(ld.key());
      Recycled<BindingMap> bindings;
      createBindings(norm, /* reversed */ false,
          [&](int var, auto term) { 
            _nextVar = std::max(_nextVar, var + 1);
            bindings->insert(var, term);
          });
      if (doInsert) insert(*bindings, ld);
      else          remove(*bindings, ld);
    }